

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationBuilder::addOnlyClosure
          (CollationBuilder *this,UnicodeString *nfdPrefix,UnicodeString *nfdString,int64_t *newCEs,
          int32_t newCEsLength,uint32_t ce32,UErrorCode *errorCode)

{
  UBool UVar1;
  undefined1 local_3a8 [8];
  UnicodeString str_1;
  undefined1 local_360 [7];
  UBool samePrefix;
  UnicodeString prefix_1;
  CanonicalIterator stringIter_1;
  CanonicalIterator prefixIter;
  UnicodeString str;
  UnicodeString prefix;
  undefined1 local_100 [8];
  CanonicalIterator stringIter;
  uint32_t ce32_local;
  int32_t newCEsLength_local;
  int64_t *newCEs_local;
  UnicodeString *nfdString_local;
  UnicodeString *nfdPrefix_local;
  CollationBuilder *this_local;
  
  stringIter.nfcImpl._0_4_ = ce32;
  stringIter.nfcImpl._4_4_ = newCEsLength;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    UVar1 = icu_63::UnicodeString::isEmpty(nfdPrefix);
    if (UVar1 == '\0') {
      CanonicalIterator::CanonicalIterator
                ((CanonicalIterator *)&stringIter_1.nfcImpl,nfdPrefix,errorCode);
      CanonicalIterator::CanonicalIterator
                ((CanonicalIterator *)((long)&prefix_1.fUnion + 0x30),nfdString,errorCode);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 == '\0') {
        do {
          do {
            CanonicalIterator::next
                      ((UnicodeString *)local_360,(CanonicalIterator *)&stringIter_1.nfcImpl);
            UVar1 = icu_63::UnicodeString::isBogus((UnicodeString *)local_360);
            if (UVar1 == '\0') {
              UVar1 = ignorePrefix(this,(UnicodeString *)local_360,errorCode);
              if (UVar1 == '\0') {
                str_1.fUnion.fStackFields.fBuffer[0x1a]._1_1_ =
                     icu_63::UnicodeString::operator==((UnicodeString *)local_360,nfdPrefix);
                do {
                  do {
                    CanonicalIterator::next
                              ((UnicodeString *)local_3a8,
                               (CanonicalIterator *)((long)&prefix_1.fUnion + 0x30));
                    UVar1 = icu_63::UnicodeString::isBogus((UnicodeString *)local_3a8);
                    if (UVar1 == '\0') {
                      UVar1 = ignoreString(this,(UnicodeString *)local_3a8,errorCode);
                      if ((UVar1 == '\0') &&
                         ((str_1.fUnion.fStackFields.fBuffer[0x1a]._1_1_ == '\0' ||
                          (UVar1 = icu_63::UnicodeString::operator==
                                             ((UnicodeString *)local_3a8,nfdString), UVar1 == '\0'))
                         )) {
                        stringIter.nfcImpl._0_4_ =
                             addIfDifferent(this,(UnicodeString *)local_360,
                                            (UnicodeString *)local_3a8,newCEs,
                                            stringIter.nfcImpl._4_4_,(uint32_t)stringIter.nfcImpl,
                                            errorCode);
                        UVar1 = ::U_FAILURE(*errorCode);
                        if (UVar1 == '\0') {
                          prefix.fUnion._48_4_ = 0;
                        }
                        else {
                          this_local._4_4_ = (uint32_t)stringIter.nfcImpl;
                          prefix.fUnion._48_4_ = 1;
                        }
                      }
                      else {
                        prefix.fUnion._48_4_ = 7;
                      }
                    }
                    else {
                      prefix.fUnion._48_4_ = 6;
                    }
                    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_3a8);
                  } while (prefix.fUnion._48_4_ == 0);
                  if (prefix.fUnion._48_4_ == 6) {
                    CanonicalIterator::reset((CanonicalIterator *)((long)&prefix_1.fUnion + 0x30));
                    prefix.fUnion._48_4_ = 0;
                    break;
                  }
                } while (prefix.fUnion._48_4_ == 7);
              }
              else {
                prefix.fUnion._48_4_ = 5;
              }
            }
            else {
              prefix.fUnion._48_4_ = 4;
            }
            icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_360);
          } while (prefix.fUnion._48_4_ == 0);
          if (prefix.fUnion._48_4_ == 4) {
            prefix.fUnion._48_4_ = 0;
            break;
          }
        } while (prefix.fUnion._48_4_ == 5);
      }
      else {
        this_local._4_4_ = (uint32_t)stringIter.nfcImpl;
        prefix.fUnion._48_4_ = 1;
      }
      CanonicalIterator::~CanonicalIterator((CanonicalIterator *)((long)&prefix_1.fUnion + 0x30));
      CanonicalIterator::~CanonicalIterator((CanonicalIterator *)&stringIter_1.nfcImpl);
    }
    else {
      CanonicalIterator::CanonicalIterator((CanonicalIterator *)local_100,nfdString,errorCode);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 == '\0') {
        icu_63::UnicodeString::UnicodeString((UnicodeString *)((long)&str.fUnion + 0x30));
        do {
          do {
            CanonicalIterator::next
                      ((UnicodeString *)&prefixIter.nfcImpl,(CanonicalIterator *)local_100);
            UVar1 = icu_63::UnicodeString::isBogus((UnicodeString *)&prefixIter.nfcImpl);
            if (UVar1 == '\0') {
              UVar1 = ignoreString(this,(UnicodeString *)&prefixIter.nfcImpl,errorCode);
              if ((UVar1 == '\0') &&
                 (UVar1 = icu_63::UnicodeString::operator==
                                    ((UnicodeString *)&prefixIter.nfcImpl,nfdString), UVar1 == '\0')
                 ) {
                stringIter.nfcImpl._0_4_ =
                     addIfDifferent(this,(UnicodeString *)((long)&str.fUnion + 0x30),
                                    (UnicodeString *)&prefixIter.nfcImpl,newCEs,
                                    stringIter.nfcImpl._4_4_,(uint32_t)stringIter.nfcImpl,errorCode)
                ;
                UVar1 = ::U_FAILURE(*errorCode);
                if (UVar1 == '\0') {
                  prefix.fUnion._48_4_ = 0;
                }
                else {
                  this_local._4_4_ = (uint32_t)stringIter.nfcImpl;
                  prefix.fUnion._48_4_ = 1;
                }
              }
              else {
                prefix.fUnion._48_4_ = 3;
              }
            }
            else {
              prefix.fUnion._48_4_ = 2;
            }
            icu_63::UnicodeString::~UnicodeString((UnicodeString *)&prefixIter.nfcImpl);
          } while (prefix.fUnion._48_4_ == 0);
          if (prefix.fUnion._48_4_ == 2) {
            prefix.fUnion._48_4_ = 0;
            break;
          }
        } while (prefix.fUnion._48_4_ == 3);
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&str.fUnion + 0x30));
      }
      else {
        this_local._4_4_ = (uint32_t)stringIter.nfcImpl;
        prefix.fUnion._48_4_ = 1;
      }
      CanonicalIterator::~CanonicalIterator((CanonicalIterator *)local_100);
    }
    if (prefix.fUnion._48_4_ == 0) {
      this_local._4_4_ = (uint32_t)stringIter.nfcImpl;
    }
  }
  else {
    this_local._4_4_ = (uint32_t)stringIter.nfcImpl;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationBuilder::addOnlyClosure(const UnicodeString &nfdPrefix, const UnicodeString &nfdString,
                                 const int64_t newCEs[], int32_t newCEsLength, uint32_t ce32,
                                 UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return ce32; }

    // Map from canonically equivalent input to the CEs. (But not from the all-NFD input.)
    if(nfdPrefix.isEmpty()) {
        CanonicalIterator stringIter(nfdString, errorCode);
        if(U_FAILURE(errorCode)) { return ce32; }
        UnicodeString prefix;
        for(;;) {
            UnicodeString str = stringIter.next();
            if(str.isBogus()) { break; }
            if(ignoreString(str, errorCode) || str == nfdString) { continue; }
            ce32 = addIfDifferent(prefix, str, newCEs, newCEsLength, ce32, errorCode);
            if(U_FAILURE(errorCode)) { return ce32; }
        }
    } else {
        CanonicalIterator prefixIter(nfdPrefix, errorCode);
        CanonicalIterator stringIter(nfdString, errorCode);
        if(U_FAILURE(errorCode)) { return ce32; }
        for(;;) {
            UnicodeString prefix = prefixIter.next();
            if(prefix.isBogus()) { break; }
            if(ignorePrefix(prefix, errorCode)) { continue; }
            UBool samePrefix = prefix == nfdPrefix;
            for(;;) {
                UnicodeString str = stringIter.next();
                if(str.isBogus()) { break; }
                if(ignoreString(str, errorCode) || (samePrefix && str == nfdString)) { continue; }
                ce32 = addIfDifferent(prefix, str, newCEs, newCEsLength, ce32, errorCode);
                if(U_FAILURE(errorCode)) { return ce32; }
            }
            stringIter.reset();
        }
    }
    return ce32;
}